

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O2

bool __thiscall zmq::ipc_listener_t::filter(ipc_listener_t *this,fd_t sock_)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  passwd *ppVar4;
  group *pgVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  char **ppcVar8;
  _Self __tmp;
  ucred cred;
  socklen_t size;
  
  if (((*(size_t *)
         ((long)&(this->super_stream_listener_base_t).super_own_t.options.ipc_uid_accept_filters.
                 _M_t._M_impl.super__Rb_tree_header + 0x20) != 0) ||
      (*(size_t *)
        ((long)&(this->super_stream_listener_base_t).super_own_t.options.ipc_pid_accept_filters._M_t
                ._M_impl.super__Rb_tree_header + 0x20) != 0)) ||
     (bVar7 = true,
     *(size_t *)
      ((long)&(this->super_stream_listener_base_t).super_own_t.options.ipc_gid_accept_filters._M_t.
              _M_impl.super__Rb_tree_header + 0x20) != 0)) {
    size = 0xc;
    iVar1 = getsockopt(sock_,1,0x11,&cred,&size);
    if (iVar1 == 0) {
      iVar2 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find(&(this->super_stream_listener_base_t).super_own_t.options.
                      ipc_uid_accept_filters._M_t,&cred.uid);
      if (iVar2._M_node !=
          &(this->super_stream_listener_base_t).super_own_t.options.ipc_uid_accept_filters._M_t.
           _M_impl.super__Rb_tree_header._M_header) {
        return true;
      }
      iVar2 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find(&(this->super_stream_listener_base_t).super_own_t.options.
                      ipc_gid_accept_filters._M_t,&cred.gid);
      if (iVar2._M_node !=
          &(this->super_stream_listener_base_t).super_own_t.options.ipc_gid_accept_filters._M_t.
           _M_impl.super__Rb_tree_header._M_header) {
        return true;
      }
      iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&(this->super_stream_listener_base_t).super_own_t.options.ipc_pid_accept_filters.
                    _M_t,&cred.pid);
      if (iVar3._M_node !=
          &(this->super_stream_listener_base_t).super_own_t.options.ipc_pid_accept_filters._M_t.
           _M_impl.super__Rb_tree_header._M_header) {
        return true;
      }
      ppVar4 = getpwuid(cred.uid);
      if (ppVar4 != (passwd *)0x0) {
        for (p_Var6 = *(_Base_ptr *)
                       ((long)&(this->super_stream_listener_base_t).super_own_t.options.
                               ipc_gid_accept_filters._M_t._M_impl.super__Rb_tree_header + 0x10);
            p_Var6 != iVar2._M_node; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          pgVar5 = getgrgid(p_Var6[1]._M_color);
          if (pgVar5 != (group *)0x0) {
            ppcVar8 = pgVar5->gr_mem;
            while (*ppcVar8 != (char *)0x0) {
              iVar1 = strcmp(*ppcVar8,ppVar4->pw_name);
              ppcVar8 = ppcVar8 + 1;
              if (iVar1 == 0) {
                return true;
              }
            }
          }
        }
      }
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool zmq::ipc_listener_t::filter (fd_t sock_)
{
    if (options.ipc_uid_accept_filters.empty ()
        && options.ipc_pid_accept_filters.empty ()
        && options.ipc_gid_accept_filters.empty ())
        return true;

    struct ucred cred;
    socklen_t size = sizeof (cred);

    if (getsockopt (sock_, SOL_SOCKET, SO_PEERCRED, &cred, &size))
        return false;
    if (options.ipc_uid_accept_filters.find (cred.uid)
          != options.ipc_uid_accept_filters.end ()
        || options.ipc_gid_accept_filters.find (cred.gid)
             != options.ipc_gid_accept_filters.end ()
        || options.ipc_pid_accept_filters.find (cred.pid)
             != options.ipc_pid_accept_filters.end ())
        return true;

    const struct passwd *pw;
    const struct group *gr;

    if (!(pw = getpwuid (cred.uid)))
        return false;
    for (options_t::ipc_gid_accept_filters_t::const_iterator
           it = options.ipc_gid_accept_filters.begin (),
           end = options.ipc_gid_accept_filters.end ();
         it != end; it++) {
        if (!(gr = getgrgid (*it)))
            continue;
        for (char **mem = gr->gr_mem; *mem; mem++) {
            if (!strcmp (*mem, pw->pw_name))
                return true;
        }
    }
    return false;
}